

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O0

ValidPadding * __thiscall
CoreML::Specification::ConvolutionLayerParams::mutable_valid(ConvolutionLayerParams *this)

{
  bool bVar1;
  ValidPadding *this_00;
  ConvolutionLayerParams *this_local;
  
  bVar1 = has_valid(this);
  if (!bVar1) {
    clear_ConvolutionPaddingType(this);
    set_has_valid(this);
    this_00 = (ValidPadding *)operator_new(0x20);
    ValidPadding::ValidPadding(this_00);
    (this->ConvolutionPaddingType_).valid_ = this_00;
  }
  return (this->ConvolutionPaddingType_).valid_;
}

Assistant:

inline ::CoreML::Specification::ValidPadding* ConvolutionLayerParams::mutable_valid() {
  if (!has_valid()) {
    clear_ConvolutionPaddingType();
    set_has_valid();
    ConvolutionPaddingType_.valid_ = new ::CoreML::Specification::ValidPadding;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.ConvolutionLayerParams.valid)
  return ConvolutionPaddingType_.valid_;
}